

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O2

void __thiscall Zippy::ZipArchive::Save(ZipArchive *this,string *filename)

{
  pointer pZVar1;
  pointer pBuf;
  ZipArchive *this_00;
  string *fileName;
  mz_bool mVar2;
  size_type sVar3;
  ZipRuntimeError *pZVar4;
  char *pcVar5;
  ZipLogicError *this_01;
  int length;
  pointer this_02;
  mz_zip_error errordata;
  allocator<char> local_f9;
  ZipArchive *local_f8;
  string local_f0;
  string *local_d0;
  string tempPath;
  mz_zip_archive tempArchive;
  
  if (this->m_IsOpen == false) {
    this_01 = (ZipLogicError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tempArchive,"Cannot call Save on empty ZipArchive object!",
               (allocator<char> *)&tempPath);
    ZipLogicError::ZipLogicError(this_01,(string *)&tempArchive);
    __cxa_throw(this_01,&ZipLogicError::typeinfo,std::logic_error::~logic_error);
  }
  if (filename->_M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (filename,&this->m_ArchivePath);
  }
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (filename,'/',0xffffffffffffffff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tempArchive,
             filename,0,sVar3 + 1);
  Impl::GenerateRandomName_abi_cxx11_(&local_f0,(Impl *)0x14,length);
  local_d0 = filename;
  std::operator+(&tempPath,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tempArchive,
                 &local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&tempArchive);
  tempArchive.m_pAlloc_opaque = (void *)0x0;
  tempArchive.m_pRead = (mz_file_read_func)0x0;
  tempArchive.m_pWrite = (mz_file_write_func)0x0;
  tempArchive.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
  tempArchive.m_pIO_opaque = (void *)0x0;
  tempArchive.m_pState = (mz_zip_internal_state *)0x0;
  tempArchive.m_archive_size = 0;
  tempArchive.m_central_directory_file_ofs = 0;
  tempArchive.m_total_files = 0;
  tempArchive.m_zip_mode = MZ_ZIP_MODE_INVALID;
  tempArchive.m_zip_type = MZ_ZIP_TYPE_INVALID;
  tempArchive.m_last_error = MZ_ZIP_NO_ERROR;
  tempArchive.m_file_offset_alignment = 0;
  tempArchive.m_pAlloc = (mz_alloc_func)0x0;
  tempArchive.m_pFree = (mz_free_func)0x0;
  tempArchive.m_pRealloc = (mz_realloc_func)0x0;
  mz_zip_writer_init_file(&tempArchive,tempPath._M_dataplus._M_p,0);
  this_02 = (this->m_ZipEntries).
            super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pZVar1 = (this->m_ZipEntries).
           super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_f8 = this;
  do {
    if (this_02 == pZVar1) {
      mz_zip_writer_finalize_archive(&tempArchive);
      this_00 = local_f8;
      mz_zip_writer_end(&tempArchive);
      mVar2 = mz_zip_validate_file_archive(tempPath._M_dataplus._M_p,0,&errordata);
      if (mVar2 != 0) {
        Close(this_00);
        fileName = local_d0;
        remove((local_d0->_M_dataplus)._M_p);
        rename(tempPath._M_dataplus._M_p,(fileName->_M_dataplus)._M_p);
        Open(this_00,fileName);
        std::__cxx11::string::~string((string *)&tempPath);
        return;
      }
      pZVar4 = (ZipRuntimeError *)__cxa_allocate_exception(0x10);
      pcVar5 = mz_zip_get_error_string(errordata);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar5,&local_f9);
      ZipRuntimeError::ZipRuntimeError(pZVar4,&local_f0);
      __cxa_throw(pZVar4,&ZipRuntimeError::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((this_02->m_EntryInfo).m_is_directory == 0) {
      if (this_02->m_IsModified == false) {
        mVar2 = mz_zip_writer_add_from_zip_reader
                          (&tempArchive,&this->m_Archive,(this_02->m_EntryInfo).m_file_index);
        if (mVar2 == 0) {
          pZVar4 = (ZipRuntimeError *)__cxa_allocate_exception(0x10);
          pcVar5 = mz_zip_get_error_string((local_f8->m_Archive).m_last_error);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,pcVar5,(allocator<char> *)&errordata);
          ZipRuntimeError::ZipRuntimeError(pZVar4,&local_f0);
          __cxa_throw(pZVar4,&ZipRuntimeError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        Impl::ZipEntry::GetName_abi_cxx11_(&local_f0,this_02);
        pBuf = (this_02->m_EntryData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
        mVar2 = mz_zip_writer_add_mem
                          (&tempArchive,local_f0._M_dataplus._M_p,pBuf,
                           (long)(this_02->m_EntryData).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pBuf,0xffffffff);
        std::__cxx11::string::~string((string *)&local_f0);
        if (mVar2 == 0) {
          pZVar4 = (ZipRuntimeError *)__cxa_allocate_exception(0x10);
          pcVar5 = mz_zip_get_error_string((local_f8->m_Archive).m_last_error);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,pcVar5,(allocator<char> *)&errordata);
          ZipRuntimeError::ZipRuntimeError(pZVar4,&local_f0);
          __cxa_throw(pZVar4,&ZipRuntimeError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    this_02 = this_02 + 1;
  } while( true );
}

Assistant:

void Save(std::string filename = "") {

            if (!IsOpen()) throw ZipLogicError("Cannot call Save on empty ZipArchive object!");

            if (filename.empty())
                filename = m_ArchivePath;

            // ===== Generate a random file name with the same path as the current file
            std::string tempPath = filename.substr(0, filename.rfind('/') + 1) + Impl::GenerateRandomName(20);

            // ===== Prepare an temporary archive file with the random filename;
            mz_zip_archive tempArchive = mz_zip_archive();
            mz_zip_writer_init_file(&tempArchive, tempPath.c_str(), 0);

            // ===== Iterate through the ZipEntries and add entries to the temporary file
            for (auto& file : m_ZipEntries) {
                if (file.IsDirectory()) continue; //TODO: Ensure this is the right thing to do (Excel issue)
                if (!file.IsModified()) {
                    if (!mz_zip_writer_add_from_zip_reader(&tempArchive, &m_Archive, file.Index()))
                        throw ZipRuntimeError(mz_zip_get_error_string(m_Archive.m_last_error));
                }

                else {
                    if (!mz_zip_writer_add_mem(&tempArchive,
                                               file.GetName().c_str(),
                                               file.m_EntryData.data(),
                                               file.m_EntryData.size(),
                                               MZ_DEFAULT_COMPRESSION))
                        throw ZipRuntimeError(mz_zip_get_error_string(m_Archive.m_last_error));
                }

            }

            // ===== Finalize and close the temporary archive
            mz_zip_writer_finalize_archive(&tempArchive);
            mz_zip_writer_end(&tempArchive);

            // ===== Validate the temporary file
            mz_zip_error errordata;
            if (!mz_zip_validate_file_archive(tempPath.c_str(), 0, &errordata))
                throw ZipRuntimeError(mz_zip_get_error_string(errordata));

            // ===== Close the current archive, delete the file with input filename (if it exists), rename the temporary and call Open.
            Close();
            std::remove(filename.c_str());
            std::rename(tempPath.c_str(), filename.c_str());
            Open(filename);

        }